

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

void __thiscall inja::Environment::~Environment(Environment *this)

{
  Environment *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>_>
  ::~map(&this->m_included_templates);
  FunctionStorage::~FunctionStorage(&this->m_callbacks);
  LexerConfig::~LexerConfig(&this->m_lexer_config);
  std::__cxx11::string::~string((string *)&this->m_output_path);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Environment(): Environment("") { }